

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintVersion(cmDocumentation *this,ostream *os)

{
  size_t sVar1;
  char *__s;
  pointer __s_00;
  
  if ((this->NameString)._M_string_length == 0) {
    __s_00 = "CMake";
  }
  else {
    __s_00 = (this->NameString)._M_dataplus._M_p;
  }
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s_00,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," version ",9);
  __s = cmVersion::GetCMakeVersion();
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"\n\nCMake suite maintained and supported by Kitware (kitware.com/cmake).\n",0x47);
  return true;
}

Assistant:

bool cmDocumentation::PrintVersion(std::ostream& os)
{
  os <<
    this->GetNameString() <<
    " version " << cmVersion::GetCMakeVersion() << "\n"
    "\n"
    "CMake suite maintained and supported by Kitware (kitware.com/cmake).\n"
    ;
  return true;
}